

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::drawItemHelper
          (QGraphicsScenePrivate *this,QGraphicsItem *item,QPainter *painter,
          QStyleOptionGraphicsItem *option,QWidget *widget,bool painterStateProtection)

{
  QRect QVar1;
  QRect QVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  QGraphicsItemPrivate *pQVar10;
  ulong uVar11;
  QWidget *pQVar12;
  QGraphicsItemCache *pQVar13;
  DeviceData *__dest;
  QTransform *pQVar14;
  void *pvVar15;
  long lVar16;
  QPoint *in_RDX;
  QWidget *in_RSI;
  long in_RDI;
  long in_R8;
  byte in_R9B;
  long in_FS_OFFSET;
  double dVar17;
  double dVar18;
  qreal qVar19;
  qreal qVar20;
  undefined1 auVar21 [16];
  QRect *r;
  const_iterator __end4_3;
  const_iterator __begin4_3;
  add_const_t<QRegion> *__range4_3;
  QRectF *rect_2;
  add_const_t<QList<QRectF>_> *__range4_2;
  QRectF *rect_1;
  add_const_t<QList<QRectF>_> *__range4_1;
  int dy;
  int dx;
  bool simpleTransform;
  bool allowPartialCacheExposure;
  DeviceData *deviceData;
  bool pixModified;
  QRectF *rect;
  add_const_t<QList<QRectF>_> *__range4;
  int adjust;
  bool fixedCacheSize;
  QGraphicsItemCache *itemCache;
  bool pixmapFound;
  qreal windowOpacity;
  QGraphicsProxyWidget *proxy;
  qreal newPainterOpacity;
  qreal oldPainterOpacity;
  qreal devicePixelRatio;
  CacheMode cacheMode;
  QGraphicsItemPrivate *itemd;
  const_iterator __end4_2;
  const_iterator __begin4_2;
  QRectF br_1;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  QRegion pixmapExposed_1;
  QPointF p;
  QRegion exposed;
  QPainter newPixPainter;
  QPixmap newPix;
  QPoint diff_1;
  QPoint newCacheIndent;
  QRegion scrollExposure;
  bool invertable;
  QSize maximumCacheSize;
  QRect viewRect;
  QRect deviceRect;
  QRectF deviceBounds;
  const_iterator __end4;
  const_iterator __begin4;
  QRectF exposedRect;
  QRegion pixmapExposed;
  QPointF scale;
  QSize adjustSize;
  QRect br;
  QSize pixmapSize;
  QPixmap pix;
  Key pixmapKey;
  QRectF adjustedBrect;
  QRectF brect;
  QTransform restoreTransform;
  QTransform pixmapToItem;
  QTransform itemToPixmap_1;
  QTransform diff;
  QTransform itemToPixmap;
  uint in_stack_fffffffffffff6a8;
  int in_stack_fffffffffffff6ac;
  QStyleOptionGraphicsItem *in_stack_fffffffffffff6b0;
  QStyleOptionGraphicsItem *in_stack_fffffffffffff6b8;
  QPoint *pm;
  QWidget *in_stack_fffffffffffff6c0;
  QPoint *p_00;
  QWidget *in_stack_fffffffffffff6c8;
  QRectF *in_stack_fffffffffffff6d0;
  int in_stack_fffffffffffff6d8;
  int in_stack_fffffffffffff6dc;
  int in_stack_fffffffffffff6e0;
  int in_stack_fffffffffffff6e4;
  int in_stack_fffffffffffff6e8;
  int in_stack_fffffffffffff6ec;
  bool local_8f1;
  bool local_8e1;
  undefined8 in_stack_fffffffffffff720;
  undefined2 uVar22;
  QWidget *in_stack_fffffffffffff728;
  QStyleOptionGraphicsItem *in_stack_fffffffffffff730;
  QPainter *in_stack_fffffffffffff738;
  QGraphicsItem *in_stack_fffffffffffff740;
  QGraphicsItem *item_00;
  QPainter *local_8b8;
  undefined8 in_stack_fffffffffffff768;
  QFlagsStorage<QPainter::RenderHint> QVar23;
  bool local_85a;
  bool local_859;
  long local_848;
  QGraphicsProxyWidget *local_840;
  long local_7e8;
  bool local_7a9;
  double local_758;
  Key local_6f0;
  undefined8 local_6e8;
  undefined8 local_6e0;
  undefined8 local_6d8;
  undefined8 local_6d0;
  undefined1 local_6c8 [16];
  QRectF *local_698;
  const_iterator local_690;
  const_iterator local_688;
  qreal local_680;
  qreal local_678;
  qreal local_670;
  qreal local_668;
  QRectF local_660;
  undefined1 local_640 [32];
  QRect local_620;
  QRect local_610;
  QRectF *local_600;
  const_iterator local_5f8;
  const_iterator local_5f0;
  QRegion local_5e8;
  QPoint local_5e0;
  QPointF local_5d8;
  QSize local_5c8;
  QSize local_5c0;
  QPixmap local_5b8 [24];
  undefined8 local_5a0;
  QSize local_598;
  QSize local_590;
  QPoint local_588;
  undefined8 local_580;
  QSize local_578;
  QPoint local_570;
  undefined1 local_568 [16];
  QRegion local_558;
  undefined8 local_550;
  QSize local_548;
  undefined1 local_538 [16];
  QRegion local_528;
  QPoint local_520;
  undefined1 *local_518;
  QSize local_510;
  QSize local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  QPoint local_4e8;
  undefined8 local_4e0;
  QSize local_4d8;
  QSize local_4d0;
  QPoint local_4c8;
  QPoint local_4c0;
  QRegion local_4b8 [2];
  QPixmap local_4a8 [28];
  QPoint local_48c;
  byte local_481;
  long local_480;
  undefined1 *local_478;
  undefined1 local_470 [16];
  QRect local_460;
  undefined1 local_450 [16];
  undefined8 local_440;
  undefined8 local_438;
  undefined8 local_430;
  undefined8 local_428;
  QPoint local_420;
  QPoint local_418;
  Key local_410;
  undefined1 local_408 [32];
  undefined1 local_3e8 [16];
  QRectF *local_3d8;
  const_iterator local_3d0;
  const_iterator local_3c8;
  QRectF local_3c0;
  QRegion local_3a0;
  QPointF local_398;
  QSize local_388;
  QPixmap local_380 [24];
  undefined8 local_368;
  QSize local_360;
  undefined1 *local_358;
  QSize local_350;
  undefined1 local_348 [16];
  QSize local_338;
  long local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  Key local_310;
  QRectF local_308;
  QRectF local_2e8;
  QColor local_2c8;
  undefined1 local_2b8 [80];
  undefined1 local_268 [80];
  undefined1 local_218 [80];
  undefined1 local_1c8 [80];
  QTransform local_178;
  QTransform local_128;
  QVariant local_d8;
  undefined1 local_b8 [176];
  long local_8;
  
  uVar22 = (undefined2)((ulong)in_stack_fffffffffffff720 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar10 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::data
                      ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                        *)&in_RSI->field_0x8);
  uVar11 = *(ulong *)&pQVar10->field_0x160 >> 0x15;
  uVar7 = (uint)uVar11 & 3;
  if ((uVar11 & 3) == 0) {
    _q_paintItem(in_stack_fffffffffffff740,in_stack_fffffffffffff738,in_stack_fffffffffffff730,
                 in_stack_fffffffffffff728,SUB21((ushort)uVar22 >> 8,0),SUB21(uVar22,0));
    QVar2.x2.m_i = local_348._8_4_;
    QVar2.y2.m_i = local_348._12_4_;
    QVar2.x1.m_i = local_348._0_4_;
    QVar2.y1.m_i = local_348._4_4_;
    goto LAB_009d5cd3;
  }
  QPainter::device();
  dVar17 = (double)QPaintDevice::devicePixelRatio();
  dVar18 = (double)QPainter::opacity();
  bVar3 = QGraphicsItem::isWidget((QGraphicsItem *)0x9d3bc1);
  if (bVar3) {
    local_840 = qobject_cast<QGraphicsProxyWidget*>((QObject *)0x9d3c0c);
  }
  else {
    local_840 = (QGraphicsProxyWidget *)0x0;
  }
  local_758 = dVar18;
  if ((local_840 != (QGraphicsProxyWidget *)0x0) &&
     (pQVar12 = QGraphicsProxyWidget::widget((QGraphicsProxyWidget *)in_stack_fffffffffffff6b0),
     pQVar12 != (QWidget *)0x0)) {
    QGraphicsProxyWidget::widget((QGraphicsProxyWidget *)in_stack_fffffffffffff6b0);
    qVar19 = QWidget::windowOpacity(in_stack_fffffffffffff6c0);
    if (qVar19 < 1.0) {
      local_758 = qVar19 * dVar18;
    }
  }
  local_2e8.xp = -NAN;
  local_2e8.yp = -NAN;
  local_2e8.w = -NAN;
  local_2e8.h = -NAN;
  (**(code **)(*(long *)in_RSI + 0x18))(&local_2e8);
  local_308.xp = local_2e8.xp;
  local_308.yp = local_2e8.yp;
  local_308.w = local_2e8.w;
  local_308.h = local_2e8.h;
  _q_adjustRect((QRectF *)0x9d3d79);
  bVar3 = QRectF::isEmpty(&local_308);
  QVar2.x2.m_i = local_348._8_4_;
  QVar2.y2.m_i = local_348._12_4_;
  QVar2.x1.m_i = local_348._0_4_;
  QVar2.y1.m_i = local_348._4_4_;
  if (bVar3) goto LAB_009d5cd3;
  local_310.d = (KeyData *)&DAT_aaaaaaaaaaaaaaaa;
  QPixmapCache::Key::Key(&local_310);
  local_328 = &DAT_aaaaaaaaaaaaaaaa;
  local_320 = &DAT_aaaaaaaaaaaaaaaa;
  local_318 = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap((QPixmap *)&local_328);
  pQVar13 = QGraphicsItemPrivate::extraItemCache
                      ((QGraphicsItemPrivate *)
                       CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
  if (uVar7 == 1) {
    QPixmapCache::Key::operator=(&local_310,&pQVar13->key);
  }
  else {
    local_848 = 0;
    if (in_R8 != 0) {
      local_848 = in_R8 + 0x10;
    }
    local_330 = local_848;
    QHash<QPaintDevice_*,_QGraphicsItemCache::DeviceData>::value
              ((QHash<QPaintDevice_*,_QGraphicsItemCache::DeviceData> *)in_stack_fffffffffffff6c8,
               (QPaintDevice **)in_stack_fffffffffffff6c0);
    QPixmapCache::Key::operator=
              ((Key *)in_stack_fffffffffffff6b0,
               (Key *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
    QGraphicsItemCache::DeviceData::~DeviceData((DeviceData *)0x9d3ec7);
  }
  bVar4 = QPixmapCache::find(&local_310,(QPixmap *)&local_328);
  QVar1.x2.m_i = local_348._8_4_;
  QVar1.y2.m_i = local_348._12_4_;
  QVar1.x1.m_i = local_348._0_4_;
  QVar1.y1.m_i = local_348._4_4_;
  if (uVar7 == 1) {
    local_338 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    QSize::QSize((QSize *)in_stack_fffffffffffff6b0);
    bVar3 = QSize::isValid((QSize *)in_stack_fffffffffffff6c0);
    local_348._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_348._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_348 = QRectF::toAlignedRect();
    if (bVar3) {
      local_338 = pQVar13->fixedSize;
    }
    else {
      local_350 = QRect::size((QRect *)in_stack_fffffffffffff6c0);
      local_338 = local_350;
    }
    QSize::operator*=((QSize *)in_stack_fffffffffffff6c0,(qreal)in_stack_fffffffffffff6b8);
    QSize::isValid((QSize *)in_stack_fffffffffffff6c0);
    local_358 = &DAT_aaaaaaaaaaaaaaaa;
    QSize::QSize((QSize *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6ac,
                 in_stack_fffffffffffff6a8);
    QRect::adjust((QRect *)in_stack_fffffffffffff6c0,(int)((ulong)in_stack_fffffffffffff6b8 >> 0x20)
                  ,(int)in_stack_fffffffffffff6b8,(int)((ulong)in_stack_fffffffffffff6b0 >> 0x20),
                  (int)in_stack_fffffffffffff6b0);
    bVar5 = QPixmap::isNull();
    local_859 = true;
    if ((bVar5 & 1) == 0) {
      local_85a = false;
      if (!bVar3) {
        local_360 = ::operator+((QSize *)in_stack_fffffffffffff6c0,
                                (QSize *)in_stack_fffffffffffff6b8);
        local_368 = QPixmap::size();
        local_85a = ::operator!=((QSize *)in_stack_fffffffffffff6b0,
                                 (QSize *)CONCAT44(in_stack_fffffffffffff6ac,
                                                   in_stack_fffffffffffff6a8));
      }
      local_859 = local_85a;
    }
    if (local_859 == false) {
      bVar6 = ::operator!=((QRect *)in_stack_fffffffffffff6b0,
                           (QRect *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
      if (bVar6) {
        (pQVar13->boundingRect).x1 = (Representation)local_348._0_4_;
        (pQVar13->boundingRect).y1 = (Representation)local_348._4_4_;
        (pQVar13->boundingRect).x2 = (Representation)local_348._8_4_;
        (pQVar13->boundingRect).y2 = (Representation)local_348._12_4_;
        QList<QRectF>::clear((QList<QRectF> *)in_stack_fffffffffffff6b0);
        pQVar13->allExposed = true;
      }
    }
    else {
      local_388 = ::operator+((QSize *)in_stack_fffffffffffff6c0,(QSize *)in_stack_fffffffffffff6b8)
      ;
      QPixmap::QPixmap(local_380,(QSize *)&local_388);
      QPixmap::operator=((QPixmap *)in_stack_fffffffffffff6b8,(QPixmap *)in_stack_fffffffffffff6b0);
      QPixmap::~QPixmap(local_380);
      (pQVar13->boundingRect).x1 = (Representation)local_348._0_4_;
      (pQVar13->boundingRect).y1 = (Representation)local_348._4_4_;
      (pQVar13->boundingRect).x2 = (Representation)local_348._8_4_;
      (pQVar13->boundingRect).y2 = (Representation)local_348._12_4_;
      QList<QRectF>::clear((QList<QRectF> *)in_stack_fffffffffffff6b0);
      pQVar13->allExposed = true;
    }
    if ((pQVar13->allExposed & 1U) == 0) {
      bVar6 = QList<QRectF>::isEmpty((QList<QRectF> *)0x9d4228);
      if (!bVar6) goto LAB_009d4230;
    }
    else {
LAB_009d4230:
      if ((bVar4 & 1) != 0) {
        QPixmapCache::remove(&local_310);
      }
      memcpy(local_b8,&DAT_00b44f18,0x50);
      QTransform::QTransform((QTransform *)in_stack_fffffffffffff6b0);
      if (bVar3) {
        local_398.xp = -NAN;
        local_398.yp = -NAN;
        iVar8 = QSize::width((QSize *)0x9d42a6);
        qVar19 = QRectF::width(&local_2e8);
        iVar9 = QSize::height((QSize *)0x9d42ef);
        qVar20 = QRectF::height(&local_2e8);
        QPointF::QPointF(&local_398,((double)iVar8 / dVar17) / qVar19,
                         ((double)iVar9 / dVar17) / qVar20);
        qVar19 = QPointF::x(&local_398);
        qVar20 = QPointF::y(&local_398);
        QTransform::scale(qVar19,qVar20);
      }
      iVar8 = QRect::x((QRect *)0x9d4381);
      iVar9 = QRect::y((QRect *)0x9d43a1);
      QTransform::translate((double)-iVar8,(double)-iVar9);
      QStyleOptionGraphicsItem::operator=
                (in_stack_fffffffffffff6b0,
                 (QStyleOptionGraphicsItem *)
                 CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
      local_3a0.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion(&local_3a0);
      local_3c0.xp = -NAN;
      local_3c0.yp = -NAN;
      local_3c0.w = -NAN;
      local_3c0.h = -NAN;
      QRectF::QRectF(&local_3c0);
      QVar23.i = (Int)((ulong)in_stack_fffffffffffff768 >> 0x20);
      if ((pQVar13->allExposed & 1U) == 0) {
        local_3c8.i = (QRectF *)&DAT_aaaaaaaaaaaaaaaa;
        local_3c8 = QList<QRectF>::begin((QList<QRectF> *)in_stack_fffffffffffff6b0);
        local_3d0.i = (QRectF *)&DAT_aaaaaaaaaaaaaaaa;
        local_3d0 = QList<QRectF>::end((QList<QRectF> *)in_stack_fffffffffffff6b0);
        while( true ) {
          local_3d8 = local_3d0.i;
          bVar3 = QList<QRectF>::const_iterator::operator!=(&local_3c8,local_3d0);
          QVar23.i = (Int)((ulong)in_stack_fffffffffffff768 >> 0x20);
          if (!bVar3) break;
          QList<QRectF>::const_iterator::operator*(&local_3c8);
          QRectF::operator|=((QRectF *)in_stack_fffffffffffff6b8,(QRectF *)in_stack_fffffffffffff6b0
                            );
          QTransform::mapRect((QRectF *)local_408);
          auVar21 = QRectF::toAlignedRect();
          local_3e8 = auVar21;
          QRegion::operator+=(&local_3a0,(QRect *)local_3e8);
          QList<QRectF>::const_iterator::operator++(&local_3c8);
        }
      }
      else {
        local_3c0.xp = local_2e8.xp;
        local_3c0.yp = local_2e8.yp;
        local_3c0.w = local_2e8.w;
        local_3c0.h = local_2e8.h;
      }
      *(qreal *)(in_RDI + 0x308) = local_3c0.xp;
      *(qreal *)(in_RDI + 0x310) = local_3c0.yp;
      *(qreal *)(in_RDI + 0x318) = local_3c0.w;
      *(qreal *)(in_RDI + 800) = local_3c0.h;
      QPixmap::setDevicePixelRatio(dVar17);
      QPainter::renderHints();
      in_stack_fffffffffffff6a8 = (uint)(in_R9B & 1);
      _q_paintIntoCache((QPixmap *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                        (QGraphicsItem *)in_stack_fffffffffffff6d0,
                        (QRegion *)in_stack_fffffffffffff6c8,(QTransform *)in_stack_fffffffffffff6c0
                        ,(RenderHints)QVar23.i,in_stack_fffffffffffff6b8,
                        SUB81((ulong)in_stack_fffffffffffff6b0 >> 0x38,0));
      QPixmapCache::insert((QPixmap *)&local_410);
      QPixmapCache::Key::operator=
                ((Key *)in_stack_fffffffffffff6b0,
                 (Key *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
      QPixmapCache::Key::~Key(&local_410);
      pQVar13->allExposed = false;
      QList<QRectF>::clear((QList<QRectF> *)in_stack_fffffffffffff6b0);
      QRegion::~QRegion(&local_3a0);
    }
    if ((local_758 != dVar18) || (NAN(local_758) || NAN(dVar18))) {
      QPainter::setOpacity(local_758);
      local_418 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffff6ac,
                                                   in_stack_fffffffffffff6a8));
      QPainter::drawPixmap
                ((QPainter *)in_stack_fffffffffffff6c8,(QPoint *)in_stack_fffffffffffff6c0,
                 (QPixmap *)in_stack_fffffffffffff6b8);
      QPainter::setOpacity(dVar18);
      QVar1 = (QRect)local_348;
    }
    else {
      local_420 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffff6ac,
                                                   in_stack_fffffffffffff6a8));
      QPainter::drawPixmap
                ((QPainter *)in_stack_fffffffffffff6c8,(QPoint *)in_stack_fffffffffffff6c0,
                 (QPixmap *)in_stack_fffffffffffff6b8);
      QVar1 = (QRect)local_348;
    }
  }
  else if (uVar7 == 2) {
    local_440 = 0xffffffffffffffff;
    local_438 = 0xffffffffffffffff;
    local_430 = 0xffffffffffffffff;
    local_428 = 0xffffffffffffffff;
    QPainter::worldTransform();
    QTransform::mapRect((QRectF *)&local_440);
    local_450._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_450._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_460 = QRectF::toRect((QRectF *)
                               CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
    local_450 = (undefined1  [16])
                QRect::adjusted((QRect *)CONCAT44(in_stack_fffffffffffff6ec,
                                                  in_stack_fffffffffffff6e8),
                                in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0,
                                in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8);
    bVar3 = QRect::isEmpty((QRect *)in_stack_fffffffffffff6b0);
    QVar1.x2.m_i = local_348._8_4_;
    QVar1.y2.m_i = local_348._12_4_;
    QVar1.x1.m_i = local_348._0_4_;
    QVar1.y1.m_i = local_348._4_4_;
    if (!bVar3) {
      local_470._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_470._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      if (in_R8 == 0) {
        QRect::QRect((QRect *)in_stack_fffffffffffff6b0);
      }
      else {
        local_470 = (undefined1  [16])QWidget::rect(in_stack_fffffffffffff6c8);
        uVar11 = QRect::intersects((QRect *)local_470);
        QVar1.x2.m_i = local_348._8_4_;
        QVar1.y2.m_i = local_348._12_4_;
        QVar1.x1.m_i = local_348._0_4_;
        QVar1.y1.m_i = local_348._4_4_;
        if ((uVar11 & 1) == 0) goto LAB_009d5cb9;
      }
      local_478 = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsItemPrivate::extra
                ((QGraphicsItemPrivate *)
                 CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                 (Extra)((ulong)in_stack_fffffffffffff6d0 >> 0x20));
      local_478 = (undefined1 *)::QVariant::toSize();
      ::QVariant::~QVariant(&local_d8);
      bVar3 = QSize::isEmpty((QSize *)in_stack_fffffffffffff6c0);
      if (bVar3) {
LAB_009d4aee:
        bVar3 = false;
        local_480 = 0;
        if (in_R8 != 0) {
          local_480 = in_R8 + 0x10;
        }
        __dest = QHash<QPaintDevice_*,_QGraphicsItemCache::DeviceData>::operator[]
                           ((QHash<QPaintDevice_*,_QGraphicsItemCache::DeviceData> *)
                            in_stack_fffffffffffff6c0,(QPaintDevice **)in_stack_fffffffffffff6b8);
        local_481 = 1;
        memcpy(&local_128,&DAT_00b44f68,0x50);
        QTransform::inverted((bool *)&local_128);
        if ((local_481 & 1) != 0) {
          pQVar14 = (QTransform *)QPainter::worldTransform();
          QTransform::operator*=(&local_128,pQVar14);
        }
        pvVar15 = (void *)QPainter::worldTransform();
        memcpy(__dest,pvVar15,0x4a);
        local_7a9 = false;
        local_8e1 = false;
        if ((local_481 & 1) != 0) {
          iVar8 = QTransform::type();
          local_8e1 = false;
          if (iVar8 < 2) {
            QPainter::worldTransform();
            local_8e1 = transformIsSimple((QTransform *)in_stack_fffffffffffff6c8);
          }
        }
        if (local_8e1 == false) {
          bVar3 = true;
          pQVar13->allExposed = true;
          QList<QRectF>::clear((QList<QRectF> *)in_stack_fffffffffffff6b0);
          QPoint::QPoint((QPoint *)in_stack_fffffffffffff6b0);
          __dest->cacheIndent = local_48c;
          QPixmap::QPixmap(local_4a8);
          QPixmap::operator=((QPixmap *)in_stack_fffffffffffff6b8,
                             (QPixmap *)in_stack_fffffffffffff6b0);
          QPixmap::~QPixmap(local_4a8);
        }
        else {
          bVar6 = QRect::isNull((QRect *)in_stack_fffffffffffff6b0);
          if (!bVar6) {
            QPoint::QPoint((QPoint *)in_stack_fffffffffffff6b0);
            local_7a9 = ::operator!=((QPoint *)in_stack_fffffffffffff6b0,
                                     (QPoint *)
                                     CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
          }
        }
        if (((local_7a9 == false) &&
            (bVar6 = QRect::isNull((QRect *)in_stack_fffffffffffff6b0), !bVar6)) &&
           (uVar11 = QRect::contains((QRect *)local_470,SUB81(local_450,0)), (uVar11 & 1) == 0)) {
          iVar8 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8
                                                ));
          iVar9 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8
                                                ));
          local_8f1 = true;
          if ((double)iVar9 <= (double)iVar8 * 1.2) {
            iVar8 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffff6ac,
                                                    in_stack_fffffffffffff6a8));
            iVar9 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffff6ac,
                                                    in_stack_fffffffffffff6a8));
            local_8f1 = (double)iVar8 * 1.2 < (double)iVar9;
          }
          local_7a9 = local_8f1;
        }
        local_4b8[0].d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QRegion::QRegion(local_4b8);
        if (local_7a9 == false) {
          QPoint::QPoint((QPoint *)in_stack_fffffffffffff6b0);
          __dest->cacheIndent = local_588;
          local_590 = QRect::size((QRect *)in_stack_fffffffffffff6c0);
          local_5a0 = QPixmap::size();
          local_598 = operator/((QSize *)in_stack_fffffffffffff6c0,(qreal)in_stack_fffffffffffff6b8)
          ;
          bVar6 = ::operator!=((QSize *)in_stack_fffffffffffff6b0,
                               (QSize *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8
                                                ));
          if (bVar6) {
            local_5c8 = QRect::size((QRect *)in_stack_fffffffffffff6c0);
            local_5c0 = ::operator*((QSize *)in_stack_fffffffffffff6c0,
                                    (qreal)in_stack_fffffffffffff6b8);
            QPixmap::QPixmap(local_5b8,(QSize *)&local_5c0);
            QPixmap::operator=((QPixmap *)in_stack_fffffffffffff6b8,
                               (QPixmap *)in_stack_fffffffffffff6b0);
            QPixmap::~QPixmap(local_5b8);
            bVar3 = true;
            pQVar13->allExposed = true;
            QList<QRectF>::clear((QList<QRectF> *)in_stack_fffffffffffff6b0);
          }
        }
        else {
          iVar8 = QRect::left((QRect *)0x9d4e22);
          iVar9 = QRect::left((QRect *)0x9d4e33);
          if (iVar8 < iVar9) {
            in_stack_fffffffffffff6ec = QRect::left((QRect *)0x9d4e4a);
            QRect::left((QRect *)0x9d4e5b);
          }
          in_stack_fffffffffffff6e8 = QRect::top((QRect *)0x9d4e89);
          iVar8 = QRect::top((QRect *)0x9d4e9a);
          if (in_stack_fffffffffffff6e8 < iVar8) {
            in_stack_fffffffffffff6e0 = QRect::top((QRect *)0x9d4eb1);
            in_stack_fffffffffffff6e4 = QRect::top((QRect *)0x9d4ec2);
            in_stack_fffffffffffff6e4 = in_stack_fffffffffffff6e0 - in_stack_fffffffffffff6e4;
          }
          else {
            in_stack_fffffffffffff6e4 = 0;
          }
          local_4c0 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
          QPoint::QPoint((QPoint *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6ac,
                         in_stack_fffffffffffff6a8);
          QRect::operator&=((QRect *)in_stack_fffffffffffff6b8,(QRect *)in_stack_fffffffffffff6b0);
          uVar11 = QPixmap::isNull();
          if ((uVar11 & 1) != 0) {
            QPoint::QPoint((QPoint *)in_stack_fffffffffffff6b0);
            __dest->cacheIndent = local_4c8;
            pQVar13->allExposed = true;
            QList<QRectF>::clear((QList<QRectF> *)in_stack_fffffffffffff6b0);
            bVar3 = true;
          }
          bVar6 = ::operator!=((QPoint *)in_stack_fffffffffffff6b0,
                               (QPoint *)
                               CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
          in_stack_fffffffffffff6dc = CONCAT13(1,(int3)in_stack_fffffffffffff6dc);
          if (!bVar6) {
            local_4d0 = QRect::size((QRect *)in_stack_fffffffffffff6c0);
            local_4e0 = QPixmap::size();
            local_4d8 = operator/((QSize *)in_stack_fffffffffffff6c0,
                                  (qreal)in_stack_fffffffffffff6b8);
            bVar6 = ::operator!=((QSize *)in_stack_fffffffffffff6b0,
                                 (QSize *)CONCAT44(in_stack_fffffffffffff6ac,
                                                   in_stack_fffffffffffff6a8));
            in_stack_fffffffffffff6dc = CONCAT13(bVar6,(int3)in_stack_fffffffffffff6dc);
          }
          if ((char)((uint)in_stack_fffffffffffff6dc >> 0x18) != '\0') {
            local_4e8 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
            local_4e8 = ::operator-((QPoint *)in_stack_fffffffffffff6c0,
                                    (QPoint *)in_stack_fffffffffffff6b8);
            local_500 = &DAT_aaaaaaaaaaaaaaaa;
            local_4f8 = &DAT_aaaaaaaaaaaaaaaa;
            local_4f0 = &DAT_aaaaaaaaaaaaaaaa;
            local_510 = QRect::size((QRect *)in_stack_fffffffffffff6c0);
            local_508 = ::operator*((QSize *)in_stack_fffffffffffff6c0,
                                    (qreal)in_stack_fffffffffffff6b8);
            QPixmap::QPixmap((QPixmap *)&local_500,(QSize *)&local_508);
            QColor::QColor(&local_2c8,transparent);
            QPixmap::fill((QColor *)&local_500);
            uVar11 = QPixmap::isNull();
            if ((uVar11 & 1) == 0) {
              QPixmap::setDevicePixelRatio(dVar17);
              local_518 = &DAT_aaaaaaaaaaaaaaaa;
              QPainter::QPainter((QPainter *)&local_518,(QPaintDevice *)&local_500);
              local_520 = ::operator-((QPoint *)in_stack_fffffffffffff6b0);
              QPainter::drawPixmap
                        ((QPainter *)in_stack_fffffffffffff6c8,(QPoint *)in_stack_fffffffffffff6c0,
                         (QPixmap *)in_stack_fffffffffffff6b8);
              QPainter::end();
              QPainter::~QPainter((QPainter *)&local_518);
            }
            local_528.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            QRegion::QRegion(&local_528);
            QPoint::QPoint((QPoint *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6ac,
                           in_stack_fffffffffffff6a8);
            local_550 = QPixmap::size();
            local_548 = operator/((QSize *)in_stack_fffffffffffff6c0,
                                  (qreal)in_stack_fffffffffffff6b8);
            QRect::QRect((QRect *)in_stack_fffffffffffff6d0,(QPoint *)in_stack_fffffffffffff6c8,
                         (QSize *)in_stack_fffffffffffff6c0);
            QRegion::operator+=(&local_528,(QRect *)local_538);
            uVar11 = QPixmap::isNull();
            if ((uVar11 & 1) == 0) {
              local_570 = ::operator-((QPoint *)in_stack_fffffffffffff6b0);
              local_580 = QPixmap::size();
              local_578 = operator/((QSize *)in_stack_fffffffffffff6c0,
                                    (qreal)in_stack_fffffffffffff6b8);
              QRect::QRect((QRect *)in_stack_fffffffffffff6d0,(QPoint *)in_stack_fffffffffffff6c8,
                           (QSize *)in_stack_fffffffffffff6c0);
              QRegion::QRegion(&local_558,(QRect *)local_568,Rectangle);
              QRegion::operator-=(&local_528,(QRegion *)&local_558);
              QRegion::~QRegion(&local_558);
            }
            QRegion::operator=(local_4b8,(QRegion *)&local_528);
            QPixmap::operator=((QPixmap *)&local_328,(QPixmap *)&local_500);
            bVar3 = true;
            QRegion::~QRegion(&local_528);
            QPixmap::~QPixmap((QPixmap *)&local_500);
          }
          __dest->cacheIndent = local_4c0;
        }
        if (((pQVar13->allExposed & 1U) == 0) &&
           (bVar6 = QList<QRectF>::isEmpty((QList<QRectF> *)0x9d5457), bVar6)) {
          uVar11 = QRegion::isEmpty();
          if ((uVar11 & 1) == 0) goto LAB_009d5472;
        }
        else {
LAB_009d5472:
          if ((bVar4 & 1) != 0) {
            QPixmapCache::remove(&local_310);
          }
          local_5d8.xp = -NAN;
          local_5d8.yp = -NAN;
          local_5e0 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffff6ac,
                                                       in_stack_fffffffffffff6a8));
          QPointF::QPointF((QPointF *)in_stack_fffffffffffff6b0,
                           (QPoint *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
          memcpy(&local_178,&DAT_00b44fd0,0x50);
          pvVar15 = (void *)QPainter::worldTransform();
          memcpy(&local_178,pvVar15,0x50);
          bVar3 = QPointF::isNull((QPointF *)in_stack_fffffffffffff6b0);
          if (!bVar3) {
            qVar19 = QPointF::x(&local_5d8);
            in_stack_fffffffffffff6d0 = (QRectF *)((ulong)qVar19 ^ 0x8000000000000000);
            qVar19 = QPointF::y(&local_5d8);
            QTransform::fromTranslate((double)in_stack_fffffffffffff6d0,-qVar19);
            QTransform::operator*=(&local_178,(QTransform *)local_1c8);
          }
          local_5e8.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          QRegion::QRegion(&local_5e8,(QRegion *)local_4b8);
          if ((pQVar13->allExposed & 1U) == 0) {
            local_5f0.i = (QRectF *)&DAT_aaaaaaaaaaaaaaaa;
            local_5f0 = QList<QRectF>::begin((QList<QRectF> *)in_stack_fffffffffffff6b0);
            local_5f8.i = (QRectF *)&DAT_aaaaaaaaaaaaaaaa;
            local_5f8 = QList<QRectF>::end((QList<QRectF> *)in_stack_fffffffffffff6b0);
            while( true ) {
              local_600 = local_5f8.i;
              bVar3 = QList<QRectF>::const_iterator::operator!=(&local_5f0,local_5f8);
              if (!bVar3) break;
              QList<QRectF>::const_iterator::operator*(&local_5f0);
              QTransform::mapRect((QRectF *)local_640);
              local_620 = QRectF::toRect((QRectF *)
                                         CONCAT44(in_stack_fffffffffffff6dc,
                                                  in_stack_fffffffffffff6d8));
              local_610 = QRect::adjusted((QRect *)CONCAT44(in_stack_fffffffffffff6ec,
                                                            in_stack_fffffffffffff6e8),
                                          in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0,
                                          in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8);
              QRegion::operator+=(&local_5e8,(QRect *)&local_610);
              QList<QRectF>::const_iterator::operator++(&local_5f0);
            }
          }
          local_660.xp = -NAN;
          local_660.yp = -NAN;
          local_660.w = -NAN;
          local_660.h = -NAN;
          QRectF::QRectF(&local_660);
          QVar23.i = (Int)((ulong)in_stack_fffffffffffff768 >> 0x20);
          if ((pQVar13->allExposed & 1U) == 0) {
            local_688.i = (QRectF *)&DAT_aaaaaaaaaaaaaaaa;
            local_688 = QList<QRectF>::begin((QList<QRectF> *)in_stack_fffffffffffff6b0);
            local_690.i = (QRectF *)&DAT_aaaaaaaaaaaaaaaa;
            local_690 = QList<QRectF>::end((QList<QRectF> *)in_stack_fffffffffffff6b0);
            while( true ) {
              local_698 = local_690.i;
              bVar3 = QList<QRectF>::const_iterator::operator!=(&local_688,local_690);
              if (!bVar3) break;
              QList<QRectF>::const_iterator::operator*(&local_688);
              QRectF::operator|=((QRectF *)in_stack_fffffffffffff6b8,
                                 (QRectF *)in_stack_fffffffffffff6b0);
              QList<QRectF>::const_iterator::operator++(&local_688);
            }
            memcpy(local_218,&DAT_00b45020,0x50);
            QTransform::inverted((bool *)local_218);
            local_7e8 = QRegion::begin();
            lVar16 = QRegion::end();
            for (; QVar23.i = (Int)((ulong)in_stack_fffffffffffff768 >> 0x20), local_7e8 != lVar16;
                local_7e8 = local_7e8 + 0x10) {
              auVar21 = QTransform::mapRect((QRect *)local_218);
              local_6c8 = auVar21;
              QRectF::QRectF((QRectF *)in_stack_fffffffffffff6c0,(QRect *)in_stack_fffffffffffff6b8)
              ;
              QRectF::operator|=((QRectF *)in_stack_fffffffffffff6b8,
                                 (QRectF *)in_stack_fffffffffffff6b0);
            }
          }
          else {
            (**(code **)(*(long *)in_RSI + 0x18))(&local_680);
            local_660.xp = local_680;
            local_660.yp = local_678;
            local_660.w = local_670;
            local_660.h = local_668;
          }
          QStyleOptionGraphicsItem::operator=
                    (in_stack_fffffffffffff6b0,
                     (QStyleOptionGraphicsItem *)
                     CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
          QRectF::adjusted(in_stack_fffffffffffff6d0,(qreal)in_stack_fffffffffffff6c8,
                           (qreal)in_stack_fffffffffffff6c0,(qreal)in_stack_fffffffffffff6b8,
                           (qreal)in_stack_fffffffffffff6b0);
          *(undefined8 *)(in_RDI + 0x308) = local_6e8;
          *(undefined8 *)(in_RDI + 0x310) = local_6e0;
          *(undefined8 *)(in_RDI + 0x318) = local_6d8;
          *(undefined8 *)(in_RDI + 800) = local_6d0;
          QPixmap::setDevicePixelRatio(dVar17);
          QPainter::renderHints();
          in_stack_fffffffffffff6a8 = (uint)(in_R9B & 1);
          _q_paintIntoCache((QPixmap *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8)
                            ,(QGraphicsItem *)in_stack_fffffffffffff6d0,(QRegion *)in_RSI,
                            (QTransform *)in_stack_fffffffffffff6c0,(RenderHints)QVar23.i,
                            in_stack_fffffffffffff6b8,
                            SUB81((ulong)in_stack_fffffffffffff6b0 >> 0x38,0));
          bVar3 = true;
          pQVar13->allExposed = false;
          QList<QRectF>::clear((QList<QRectF> *)in_stack_fffffffffffff6b0);
          QRegion::~QRegion(&local_5e8);
          in_stack_fffffffffffff6c8 = in_RSI;
        }
        if (bVar3) {
          QPixmapCache::insert((QPixmap *)&local_6f0);
          QPixmapCache::Key::operator=
                    ((Key *)in_stack_fffffffffffff6b0,
                     (Key *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
          QPixmapCache::Key::~Key(&local_6f0);
        }
        memcpy(local_268,&DAT_00b45070,0x50);
        pvVar15 = (void *)QPainter::worldTransform();
        memcpy(local_268,pvVar15,0x50);
        p_00 = in_RDX;
        QTransform::QTransform((QTransform *)in_stack_fffffffffffff6b0);
        QPainter::setWorldTransform((QTransform *)p_00,SUB81(local_2b8,0));
        if ((local_758 != dVar18) || (NAN(local_758) || NAN(dVar18))) {
          QPainter::setOpacity(local_758);
          pm = in_RDX;
          QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
          QPainter::drawPixmap((QPainter *)in_stack_fffffffffffff6c8,p_00,(QPixmap *)pm);
          QPainter::setOpacity(dVar18);
        }
        else {
          QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
          QPainter::drawPixmap
                    ((QPainter *)in_stack_fffffffffffff6c8,p_00,(QPixmap *)in_stack_fffffffffffff6b8
                    );
        }
        QPainter::setWorldTransform((QTransform *)in_RDX,SUB81(local_268,0));
        QRegion::~QRegion(local_4b8);
        QVar1.x2.m_i = local_348._8_4_;
        QVar1.y2.m_i = local_348._12_4_;
        QVar1.x1.m_i = local_348._0_4_;
        QVar1.y1.m_i = local_348._4_4_;
      }
      else {
        iVar8 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8))
        ;
        iVar9 = QSize::width((QSize *)0x9d49db);
        if (iVar8 <= iVar9) {
          iVar8 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffff6ac,
                                                  in_stack_fffffffffffff6a8));
          iVar9 = QSize::height((QSize *)0x9d4a09);
          if (iVar8 <= iVar9) goto LAB_009d4aee;
        }
        if (in_RSI == (QWidget *)0x0) {
          local_8b8 = (QPainter *)0x0;
        }
        else {
          local_8b8 = (QPainter *)&in_RSI[-1].field_0x18;
        }
        item_00 = (QGraphicsItem *)0x0;
        if (local_8b8 != (QPainter *)0x0) {
          item_00 = (QGraphicsItem *)(local_8b8 + 0x10);
        }
        _q_paintItem(item_00,local_8b8,in_stack_fffffffffffff730,in_stack_fffffffffffff728,
                     SUB21((ushort)uVar22 >> 8,0),SUB21(uVar22,0));
        QVar1.x2.m_i = local_348._8_4_;
        QVar1.y2.m_i = local_348._12_4_;
        QVar1.x1.m_i = local_348._0_4_;
        QVar1.y1.m_i = local_348._4_4_;
      }
    }
  }
LAB_009d5cb9:
  local_348 = (undefined1  [16])QVar1;
  QPixmap::~QPixmap((QPixmap *)&local_328);
  QPixmapCache::Key::~Key(&local_310);
  QVar2 = (QRect)local_348;
LAB_009d5cd3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    local_348 = (undefined1  [16])QVar2;
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::drawItemHelper(QGraphicsItem *item, QPainter *painter,
                                           const QStyleOptionGraphicsItem *option, QWidget *widget,
                                           bool painterStateProtection)
{
    QGraphicsItemPrivate *itemd = item->d_ptr.data();
    QGraphicsItem::CacheMode cacheMode = QGraphicsItem::CacheMode(itemd->cacheMode);

    // Render directly, using no cache.
    if (cacheMode == QGraphicsItem::NoCache) {
        _q_paintItem(static_cast<QGraphicsWidget *>(item), painter, option, widget, true, painterStateProtection);
        return;
    }

    const qreal devicePixelRatio = painter->device()->devicePixelRatio();
    const qreal oldPainterOpacity = painter->opacity();
    qreal newPainterOpacity = oldPainterOpacity;
    QGraphicsProxyWidget *proxy = item->isWidget() ? qobject_cast<QGraphicsProxyWidget *>(static_cast<QGraphicsWidget *>(item)) : 0;
    if (proxy && proxy->widget()) {
        const qreal windowOpacity = proxy->widget()->windowOpacity();
        if (windowOpacity < 1.0)
            newPainterOpacity *= windowOpacity;
    }

    // Item's (local) bounding rect
    QRectF brect = item->boundingRect();
    QRectF adjustedBrect(brect);
    _q_adjustRect(&adjustedBrect);
    if (adjustedBrect.isEmpty())
        return;

    // Fetch the off-screen transparent buffer and exposed area info.
    QPixmapCache::Key pixmapKey;
    QPixmap pix;

    bool pixmapFound;
    QGraphicsItemCache *itemCache = itemd->extraItemCache();
    if (cacheMode == QGraphicsItem::ItemCoordinateCache) {
        pixmapKey = itemCache->key;
    } else {
        pixmapKey = itemCache->deviceData.value(widget).key;
    }

    // Find pixmap in cache.
    pixmapFound = QPixmapCache::find(pixmapKey, &pix);

    // Render using item coordinate cache mode.
    if (cacheMode == QGraphicsItem::ItemCoordinateCache) {
        QSize pixmapSize;
        bool fixedCacheSize = itemCache->fixedSize.isValid();
        QRect br = brect.toAlignedRect();
        if (fixedCacheSize) {
            pixmapSize = itemCache->fixedSize;
        } else {
            pixmapSize = br.size();
        }

        pixmapSize *= devicePixelRatio;

        // Create or recreate the pixmap.
        int adjust = itemCache->fixedSize.isValid() ? 0 : 2;
        QSize adjustSize(adjust*2, adjust*2);
        br.adjust(-adjust / devicePixelRatio, -adjust / devicePixelRatio, adjust / devicePixelRatio, adjust / devicePixelRatio);
        if (pix.isNull() || (!fixedCacheSize && (pixmapSize + adjustSize) != pix.size())) {
            pix = QPixmap(pixmapSize + adjustSize);
            itemCache->boundingRect = br;
            itemCache->exposed.clear();
            itemCache->allExposed = true;
        } else if (itemCache->boundingRect != br) {
            itemCache->boundingRect = br;
            itemCache->exposed.clear();
            itemCache->allExposed = true;
        }

        // Redraw any newly exposed areas.
        if (itemCache->allExposed || !itemCache->exposed.isEmpty()) {

            //We know that we will modify the pixmap, removing it from the cache
            //will detach the one we have and avoid a deep copy
            if (pixmapFound)
                QPixmapCache::remove(pixmapKey);

            // Fit the item's bounding rect into the pixmap's coordinates.
            QTransform itemToPixmap;
            if (fixedCacheSize) {
                const QPointF scale((pixmapSize.width() / devicePixelRatio) / brect.width(),
                                    (pixmapSize.height() / devicePixelRatio) / brect.height());
                itemToPixmap.scale(scale.x(), scale.y());
            }
            itemToPixmap.translate(-br.x(), -br.y());

            // Generate the item's exposedRect and map its list of expose
            // rects to device coordinates.
            styleOptionTmp = *option;
            QRegion pixmapExposed;
            QRectF exposedRect;
            if (!itemCache->allExposed) {
                for (const auto &rect : std::as_const(itemCache->exposed)) {
                    exposedRect |= rect;
                    pixmapExposed += itemToPixmap.mapRect(rect).toAlignedRect();
                }
            } else {
                exposedRect = brect;
            }
            styleOptionTmp.exposedRect = exposedRect;

            // Render.
            pix.setDevicePixelRatio(devicePixelRatio);
            _q_paintIntoCache(&pix, item, pixmapExposed, itemToPixmap, painter->renderHints(),
                              &styleOptionTmp, painterStateProtection);

            // insert this pixmap into the cache.
            itemCache->key = QPixmapCache::insert(pix);

            // Reset expose data.
            itemCache->allExposed = false;
            itemCache->exposed.clear();
        }

        // Redraw the exposed area using the transformed painter. Depending on
        // the hardware, this may be a server-side operation, or an expensive
        // qpixmap-image-transform-pixmap roundtrip.
        if (newPainterOpacity != oldPainterOpacity) {
            painter->setOpacity(newPainterOpacity);
            painter->drawPixmap(br.topLeft(), pix);
            painter->setOpacity(oldPainterOpacity);
        } else {
            painter->drawPixmap(br.topLeft(), pix);
        }
        return;
    }

    // Render using device coordinate cache mode.
    if (cacheMode == QGraphicsItem::DeviceCoordinateCache) {
        // Find the item's bounds in device coordinates.
        QRectF deviceBounds = painter->worldTransform().mapRect(brect);
        QRect deviceRect = deviceBounds.toRect().adjusted(-1, -1, 1, 1);
        if (deviceRect.isEmpty())
            return;
        QRect viewRect = widget ? widget->rect() : QRect();
        if (widget && !viewRect.intersects(deviceRect))
            return;

        // Resort to direct rendering if the device rect exceeds the
        // (optional) maximum bounds. (QGraphicsSvgItem uses this).
        QSize maximumCacheSize =
            itemd->extra(QGraphicsItemPrivate::ExtraMaxDeviceCoordCacheSize).toSize();
        if (!maximumCacheSize.isEmpty()
            && (deviceRect.width() > maximumCacheSize.width()
                || deviceRect.height() > maximumCacheSize.height())) {
            _q_paintItem(static_cast<QGraphicsWidget *>(item), painter, option, widget,
                         oldPainterOpacity != newPainterOpacity, painterStateProtection);
            return;
        }

        // Create or reuse offscreen pixmap, possibly scroll/blit from the old one.
        // If the world transform is rotated we always recreate the cache to avoid
        // wrong blending.
        bool pixModified = false;
        QGraphicsItemCache::DeviceData *deviceData = &itemCache->deviceData[widget];
        bool invertable = true;
        QTransform diff = deviceData->lastTransform.inverted(&invertable);
        if (invertable)
            diff *= painter->worldTransform();
        deviceData->lastTransform = painter->worldTransform();
        bool allowPartialCacheExposure = false;
        bool simpleTransform = invertable && diff.type() <= QTransform::TxTranslate
                               && transformIsSimple(painter->worldTransform());
        if (!simpleTransform) {
            pixModified = true;
            itemCache->allExposed = true;
            itemCache->exposed.clear();
            deviceData->cacheIndent = QPoint();
            pix = QPixmap();
        } else if (!viewRect.isNull()) {
            allowPartialCacheExposure = deviceData->cacheIndent != QPoint();
        }

        // Allow partial cache exposure if the device rect isn't fully contained and
        // deviceRect is 20% taller or wider than the viewRect.
        if (!allowPartialCacheExposure && !viewRect.isNull() && !viewRect.contains(deviceRect)) {
            allowPartialCacheExposure = (viewRect.width() * 1.2 < deviceRect.width())
                                         || (viewRect.height() * 1.2 < deviceRect.height());
        }

        QRegion scrollExposure;
        if (allowPartialCacheExposure) {
            // Part of pixmap is drawn. Either device contains viewrect (big
            // item covers whole screen) or parts of device are outside the
            // viewport. In either case the device rect must be the intersect
            // between the two.
            int dx = deviceRect.left() < viewRect.left() ? viewRect.left() - deviceRect.left() : 0;
            int dy = deviceRect.top() < viewRect.top() ? viewRect.top() - deviceRect.top() : 0;
            QPoint newCacheIndent(dx, dy);
            deviceRect &= viewRect;

            if (pix.isNull()) {
                deviceData->cacheIndent = QPoint();
                itemCache->allExposed = true;
                itemCache->exposed.clear();
                pixModified = true;
            }

            // Copy / "scroll" the old pixmap onto the new ole and calculate
            // scrolled exposure.
            if (newCacheIndent != deviceData->cacheIndent || deviceRect.size() != pix.size() / devicePixelRatio) {
                QPoint diff = newCacheIndent - deviceData->cacheIndent;
                QPixmap newPix(deviceRect.size() * devicePixelRatio);
                // ### Investigate removing this fill (test with Plasma and
                // graphicssystem raster).
                newPix.fill(Qt::transparent);
                if (!pix.isNull()) {
                    newPix.setDevicePixelRatio(devicePixelRatio);
                    QPainter newPixPainter(&newPix);
                    newPixPainter.drawPixmap(-diff, pix);
                    newPixPainter.end();
                }
                QRegion exposed;
                exposed += QRect(QPoint(0,0), newPix.size() / devicePixelRatio);
                if (!pix.isNull())
                    exposed -= QRect(-diff, pix.size() / devicePixelRatio);
                scrollExposure = exposed;

                pix = newPix;
                pixModified = true;
            }
            deviceData->cacheIndent = newCacheIndent;
        } else {
            // Full pixmap is drawn.
            deviceData->cacheIndent = QPoint();

            // Auto-adjust the pixmap size.
            if (deviceRect.size() != pix.size() / devicePixelRatio) {
                // exposed needs to cover the whole pixmap
                pix = QPixmap(deviceRect.size() * devicePixelRatio);
                pixModified = true;
                itemCache->allExposed = true;
                itemCache->exposed.clear();
            }
        }

        // Check for newly invalidated areas.
        if (itemCache->allExposed || !itemCache->exposed.isEmpty() || !scrollExposure.isEmpty()) {
            //We know that we will modify the pixmap, removing it from the cache
            //will detach the one we have and avoid a deep copy
            if (pixmapFound)
                QPixmapCache::remove(pixmapKey);

            // Construct an item-to-pixmap transform.
            QPointF p = deviceRect.topLeft();
            QTransform itemToPixmap = painter->worldTransform();
            if (!p.isNull())
                itemToPixmap *= QTransform::fromTranslate(-p.x(), -p.y());

            // Map the item's logical expose to pixmap coordinates.
            QRegion pixmapExposed = scrollExposure;
            if (!itemCache->allExposed) {
                for (const auto &rect : std::as_const(itemCache->exposed))
                    pixmapExposed += itemToPixmap.mapRect(rect).toRect().adjusted(-1, -1, 1, 1);
            }

            // Calculate the style option's exposedRect.
            QRectF br;
            if (itemCache->allExposed) {
                br = item->boundingRect();
            } else {
                for (const auto &rect : std::as_const(itemCache->exposed))
                    br |= rect;
                QTransform pixmapToItem = itemToPixmap.inverted();
                for (const QRect &r : std::as_const(scrollExposure))
                    br |= pixmapToItem.mapRect(r);
            }
            styleOptionTmp = *option;
            styleOptionTmp.exposedRect = br.adjusted(-1, -1, 1, 1);

            // Render the exposed areas.
            pix.setDevicePixelRatio(devicePixelRatio);
            _q_paintIntoCache(&pix, item, pixmapExposed, itemToPixmap, painter->renderHints(),
                              &styleOptionTmp, painterStateProtection);

            // Reset expose data.
            pixModified = true;
            itemCache->allExposed = false;
            itemCache->exposed.clear();
        }

        if (pixModified) {
            // Insert this pixmap into the cache.
            deviceData->key = QPixmapCache::insert(pix);
        }

        // Redraw the exposed area using an untransformed painter. This
        // effectively becomes a bitblit that does not transform the cache.
        QTransform restoreTransform = painter->worldTransform();
        painter->setWorldTransform(QTransform());
        if (newPainterOpacity != oldPainterOpacity) {
            painter->setOpacity(newPainterOpacity);
            painter->drawPixmap(deviceRect.topLeft(), pix);
            painter->setOpacity(oldPainterOpacity);
        } else {
            painter->drawPixmap(deviceRect.topLeft(), pix);
        }
        painter->setWorldTransform(restoreTransform);
        return;
    }
}